

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void remove_contradictory_activation(artifact *art)

{
  effect_object_property *peVar1;
  _Bool _Var2;
  int local_48;
  int local_44;
  byte local_31;
  int local_30;
  wchar_t local_2c;
  wchar_t maxmult;
  wchar_t i;
  effect_object_property *pcurr;
  effect_object_property *props;
  wchar_t unsummarized_count;
  _Bool redundant;
  artifact *art_local;
  
  props._7_1_ = 1;
  if (art->activation != (activation *)0x0) {
    _unsummarized_count = art;
    pcurr = effect_summarize_properties(art->activation->effect,(int *)&props);
    _maxmult = pcurr;
    if ((int)props < 1) {
      while( true ) {
        local_31 = 0;
        if (_maxmult != (effect_object_property *)0x0) {
          local_31 = props._7_1_;
        }
        if ((local_31 & 1) == 0) break;
        switch(_maxmult->kind) {
        case EFPROP_OBJECT_FLAG_EXACT:
        case EFPROP_CURE_FLAG:
        case EFPROP_CONFLICT_FLAG:
          _Var2 = flag_has_dbg(_unsummarized_count->flags,5,_maxmult->idx,"art->flags","pcurr->idx")
          ;
          if (!_Var2) {
            props._7_1_ = 0;
          }
          break;
        case EFPROP_OBJECT_FLAG:
          props._7_1_ = 0;
          break;
        case EFPROP_RESIST:
        case EFPROP_CONFLICT_RESIST:
        case EFPROP_CONFLICT_VULN:
          if ((_maxmult->reslevel_min <= (int)_unsummarized_count->el_info[_maxmult->idx].res_level)
             && ((int)_unsummarized_count->el_info[_maxmult->idx].res_level <=
                 _maxmult->reslevel_max)) {
            props._7_1_ = 0;
          }
          break;
        default:
          props._7_1_ = 0;
          break;
        case EFPROP_BRAND:
          local_30 = 1;
          for (local_2c = 1; local_2c < (int)(uint)z_info->brand_max; local_2c = local_2c + 1) {
            if (((_unsummarized_count->brands[local_2c] & 1U) != 0) &&
               (brands[local_2c].resist_flag == brands[_maxmult->idx].resist_flag)) {
              if (brands[local_2c].multiplier < local_30) {
                local_44 = local_30;
              }
              else {
                local_44 = brands[local_2c].multiplier;
              }
              local_30 = local_44;
            }
          }
          if (local_30 < brands[_maxmult->idx].multiplier) {
            props._7_1_ = 0;
          }
          break;
        case EFPROP_SLAY:
          local_30 = 1;
          for (local_2c = L'\x01'; local_2c < (int)(uint)z_info->slay_max;
              local_2c = local_2c + L'\x01') {
            if (((_unsummarized_count->slays[local_2c] & 1U) != 0) &&
               (_Var2 = same_monsters_slain(local_2c,_maxmult->idx), _Var2)) {
              if (slays[local_2c].multiplier < local_30) {
                local_48 = local_30;
              }
              else {
                local_48 = slays[local_2c].multiplier;
              }
              local_30 = local_48;
            }
          }
          if (local_30 < slays[_maxmult->idx].multiplier) {
            props._7_1_ = 0;
          }
        }
        _maxmult = _maxmult->next;
      }
    }
    else {
      props._7_1_ = 0;
    }
    while (pcurr != (effect_object_property *)0x0) {
      peVar1 = pcurr->next;
      mem_free(pcurr);
      pcurr = peVar1;
    }
    if ((props._7_1_ & 1) != 0) {
      _unsummarized_count->activation = (activation *)0x0;
    }
  }
  return;
}

Assistant:

static void remove_contradictory_activation(struct artifact *art)
{
	bool redundant = true;
	int unsummarized_count;
	struct effect_object_property *props, *pcurr;

	if (!art->activation) return;

	props = effect_summarize_properties(art->activation->effect,
		&unsummarized_count);

	if (unsummarized_count > 0) {
		/*
		 * The activation does at least one thing that doesn't
		 * correspond to an object property.
		 */
		redundant = false;
	} else {
		for (pcurr = props; pcurr && redundant; pcurr = pcurr->next) {
			int i, maxmult;

			switch (pcurr->kind) {
			case EFPROP_BRAND:
				maxmult = 1;
				for (i = 1; i < z_info->brand_max; ++i) {
					if (!art->brands[i]) continue;
					if (brands[i].resist_flag !=
						brands[pcurr->idx].resist_flag) continue;
					maxmult = MAX(brands[i].multiplier,
						maxmult);
				}
				if (maxmult < brands[pcurr->idx].multiplier) {
					redundant = false;
				}
				break;

			case EFPROP_SLAY:
				maxmult = 1;
				for (i = 1; i < z_info->slay_max; ++i) {
					if (!art->slays[i]) continue;
					if (!same_monsters_slain(i, pcurr->idx)) continue;
					maxmult = MAX(slays[i].multiplier,
						maxmult);
				}
				if (maxmult < slays[pcurr->idx].multiplier) {
					redundant = false;
				}
				break;

			case EFPROP_RESIST:
			case EFPROP_CONFLICT_RESIST:
			case EFPROP_CONFLICT_VULN:
				if (art->el_info[pcurr->idx].res_level >=
						pcurr->reslevel_min &&
						art->el_info[pcurr->idx].res_level <=
						pcurr->reslevel_max) {
					redundant = false;
				}
				break;

			case EFPROP_OBJECT_FLAG:
				/*
				 * It does something more than just the object
				 * flag so don't call it redundant.  To screen
				 * out HERO and SHERO activations when the
				 * object has OF_PROT_FEAR, use the same
				 * handling for this case as for
				 * EFPROP_OBJECT_FLAG_EXACT.
				 */
				redundant = false;
				break;

			case EFPROP_OBJECT_FLAG_EXACT:
			case EFPROP_CURE_FLAG:
			case EFPROP_CONFLICT_FLAG:
				/*
				 * If the object doesn't have the flag, it's
				 * not redundant.
				 */
				if (!of_has(art->flags, pcurr->idx)) {
					redundant = false;
				}
				break;

			default:
				/*
				 * effect_summarize_properties() gave use
				 * something unexpected.  Assume the effect is
				 * useful.
				 */
				redundant = false;
				break;
			}
		}
	}

	while (props) {
		pcurr = props;
		props = props->next;
		mem_free(pcurr);
	}

	if (redundant) {
		art->activation = NULL;
	}
}